

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::ShowFontAtlas(ImFontAtlas *atlas)

{
  ImFont *font;
  bool bVar1;
  long lVar2;
  ImVec4 border_col;
  ImVec4 tint_col;
  ImVec2 local_50;
  ImVec2 local_48;
  ImVec2 local_40;
  ImVec4 local_38;
  ImVec4 local_28;
  
  if (0 < (atlas->Fonts).Size) {
    lVar2 = 0;
    do {
      font = (atlas->Fonts).Data[lVar2];
      PushID(font);
      DebugNodeFont(font);
      PopID();
      lVar2 = lVar2 + 1;
    } while (lVar2 < (atlas->Fonts).Size);
  }
  bVar1 = TreeNode("Atlas texture","Atlas texture (%dx%d pixels)",(ulong)(uint)atlas->TexWidth,
                   (ulong)(uint)atlas->TexHeight);
  if (bVar1) {
    local_28.x = 1.0;
    local_28.y = 1.0;
    local_28.z = 1.0;
    local_28.w = 1.0;
    local_38.x = 1.0;
    local_38.y = 1.0;
    local_38.z = 1.0;
    local_38.w = 0.5;
    local_40.x = (float)atlas->TexWidth;
    local_40.y = (float)atlas->TexHeight;
    local_48.x = 0.0;
    local_48.y = 0.0;
    local_50.x = 1.0;
    local_50.y = 1.0;
    Image(atlas->TexID,&local_40,&local_48,&local_50,&local_28,&local_38);
    TreePop();
  }
  return;
}

Assistant:

void ImGui::ShowFontAtlas(ImFontAtlas* atlas)
{
    for (int i = 0; i < atlas->Fonts.Size; i++)
    {
        ImFont* font = atlas->Fonts[i];
        PushID(font);
        DebugNodeFont(font);
        PopID();
    }
    if (TreeNode("Atlas texture", "Atlas texture (%dx%d pixels)", atlas->TexWidth, atlas->TexHeight))
    {
        ImVec4 tint_col = ImVec4(1.0f, 1.0f, 1.0f, 1.0f);
        ImVec4 border_col = ImVec4(1.0f, 1.0f, 1.0f, 0.5f);
        Image(atlas->TexID, ImVec2((float)atlas->TexWidth, (float)atlas->TexHeight), ImVec2(0.0f, 0.0f), ImVec2(1.0f, 1.0f), tint_col, border_col);
        TreePop();
    }
}